

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_sstring_view.cpp
# Opt level: O0

void __thiscall
SStringView_OperatorWrite_Test::TestBody::anon_class_1_0_00000001::operator()
          (anon_class_1_0_00000001 *this,string *str)

{
  bool bVar1;
  char *pcVar2;
  size_t length;
  AssertHelper local_1f0;
  Message local_1e8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1e0;
  undefined1 local_1c0 [8];
  AssertionResult gtest_ar;
  ostringstream local_1a0 [8];
  ostringstream stream;
  undefined1 local_28 [8];
  raw_sstring_view view;
  string *str_local;
  anon_class_1_0_00000001 *this_local;
  
  view.size_ = (size_type)str;
  pcVar2 = (char *)std::__cxx11::string::data();
  length = std::__cxx11::string::length();
  _local_28 = pstore::make_sstring_view(pcVar2,length);
  std::__cxx11::ostringstream::ostringstream(local_1a0);
  pstore::operator<<((basic_ostringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     local_1a0,(sstring_view<const_char_*> *)local_28);
  std::__cxx11::ostringstream::str();
  testing::internal::EqHelper::
  Compare<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_nullptr>
            ((EqHelper *)local_1c0,"stream.str ()","str",&local_1e0,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)view.size_);
  std::__cxx11::string::~string((string *)&local_1e0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_1c0);
  if (!bVar1) {
    testing::Message::Message(&local_1e8);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_1c0);
    testing::internal::AssertHelper::AssertHelper
              (&local_1f0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/unittests/adt/test_sstring_view.cpp"
               ,0x14a,pcVar2);
    testing::internal::AssertHelper::operator=(&local_1f0,&local_1e8);
    testing::internal::AssertHelper::~AssertHelper(&local_1f0);
    testing::Message::~Message(&local_1e8);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_1c0);
  std::__cxx11::ostringstream::~ostringstream(local_1a0);
  return;
}

Assistant:

TEST (SStringView, OperatorWrite) {
    auto check = [] (std::string const & str) {
        auto view = pstore::make_sstring_view (str.data (), str.length ());
        std::ostringstream stream;
        stream << view;
        EXPECT_EQ (stream.str (), str);
    };
    check ("");
    check ("abcdef");
    check ("hello world");
}